

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O1

void __thiscall E64::blitter_ic::terminal_cursor_decrease(blitter_ic *this,uint8_t no)

{
  ushort uVar1;
  blit_t *pbVar2;
  int iVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  ushort uVar5;
  
  pbVar2 = this->blit;
  iVar3 = (int)CONCAT71(in_register_00000031,no);
  uVar4 = (ulong)(uint)(iVar3 * 0x140);
  uVar5 = (short)*(undefined4 *)(pbVar2->command_buffer + (uVar4 - 0xd)) - 1;
  *(ushort *)(pbVar2->command_buffer + (uVar4 - 0xd)) = uVar5;
  uVar1 = *(ushort *)(pbVar2->command_buffer + (uVar4 - 0x3d));
  if (uVar1 <= uVar5) {
    *(ushort *)(pbVar2->command_buffer + (uVar4 - 0xd)) = uVar1 - 1;
  }
  pbVar2->command_buffer[(ulong)(uint)(iVar3 * 0x140) - 2] = uVar1 <= uVar5;
  return;
}

Assistant:

void E64::blitter_ic::terminal_cursor_decrease(uint8_t no)
{
	blit[no].cursor_position--;
	if (blit[no].cursor_position > blit[no].get_tiles() - 1) {
		blit[no].cursor_position = blit[no].get_tiles() - 1;
		blit[no].cursor_big_move = true;
	} else {
		blit[no].cursor_big_move = false;
	}
}